

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O2

int Aig_ManFindCut_int(Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited,int nSizeLimit,int nFanoutLimit)

{
  long lVar1;
  void *pvVar2;
  char *__function;
  uint uVar3;
  ulong uVar4;
  char *__assertion;
  int i;
  void *pvVar6;
  uint uVar7;
  ulong uVar5;
  
  pvVar6 = (void *)0x0;
  uVar7 = 100;
  i = 0;
  do {
    uVar3 = vFront->nSize;
    if ((int)uVar3 <= i) {
      if (pvVar6 == (void *)0x0) {
        return 0;
      }
      if (uVar7 < 3) {
LAB_00535d93:
        if (nSizeLimit < (int)(uVar3 + uVar7 + -1)) {
          return 0;
        }
        if (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7) {
          uVar4 = (ulong)uVar3;
          do {
            if ((int)uVar4 < 1) {
              __assert_fail("i >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
            }
            uVar5 = uVar4 - 1;
            lVar1 = uVar4 - 1;
            uVar4 = uVar5;
          } while (vFront->pArray[lVar1] != pvVar6);
          while (uVar4 = uVar5 + 1, (int)uVar4 < (int)uVar3) {
            vFront->pArray[uVar5] = vFront->pArray[uVar4];
            uVar5 = uVar4;
          }
          vFront->nSize = uVar3 - 1;
          pvVar2 = (void *)(*(ulong *)((long)pvVar6 + 8) & 0xfffffffffffffffe);
          if ((*(ulong *)((long)pvVar2 + 0x18) & 0x10) == 0) {
            *(ulong *)((long)pvVar2 + 0x18) = *(ulong *)((long)pvVar2 + 0x18) | 0x10;
            Vec_PtrPush(vFront,pvVar2);
            Vec_PtrPush(vVisited,pvVar2);
          }
          pvVar6 = (void *)(*(ulong *)((long)pvVar6 + 0x10) & 0xfffffffffffffffe);
          if ((*(ulong *)((long)pvVar6 + 0x18) & 0x10) == 0) {
            *(ulong *)((long)pvVar6 + 0x18) = *(ulong *)((long)pvVar6 + 0x18) | 0x10;
            Vec_PtrPush(vFront,pvVar6);
            Vec_PtrPush(vVisited,pvVar6);
          }
          if (nSizeLimit < vFront->nSize) {
            __assert_fail("Vec_PtrSize(vFront) <= nSizeLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                          ,0x81,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
          }
          return 1;
        }
        __assertion = "Aig_ObjIsNode(pFaninBest)";
        __function = "int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)";
        uVar7 = 0x6a;
      }
      else {
        __assertion = "CostBest < 3";
        __function = "int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)";
        uVar7 = 0x67;
      }
LAB_00535e87:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                    ,uVar7,__function);
    }
    pvVar2 = Vec_PtrEntry(vFront,i);
    uVar4 = *(ulong *)((long)pvVar2 + 0x18);
    if ((uVar4 & 0x10) == 0) {
      __assertion = "pNode->fMarkA";
      __function = "int Aig_NodeGetLeafCostOne(Aig_Obj_t *, int)";
      uVar7 = 0x32;
      goto LAB_00535e87;
    }
    uVar3 = 999;
    if (((((uint)uVar4 & 7) != 2) &&
        (uVar3 = (uint)((*(byte *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) &
                        0x10) == 0) +
                 (uint)((*(byte *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) &
                        0x10) == 0), 1 < uVar3)) &&
       (nFanoutLimit < (int)((uint)(uVar4 >> 6) & 0x3ffffff))) {
      uVar3 = 999;
    }
    if (((uVar3 < uVar7) ||
        ((uVar7 == uVar3 &&
         ((*(uint *)((long)pvVar6 + 0x1c) & 0xffffff) < ((uint)(uVar4 >> 0x20) & 0xffffff))))) &&
       (pvVar6 = pvVar2, uVar7 = uVar3, uVar3 == 0)) {
      uVar3 = vFront->nSize;
      uVar7 = 0;
      goto LAB_00535d93;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Aig_ManFindCut_int( Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited, int nSizeLimit, int nFanoutLimit )
{
    Aig_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Aig_Obj_t *, vFront, pNode, i )
    {
        CostCur = Aig_NodeGetLeafCostOne( pNode, nFanoutLimit );
//printf( "    Fanin %s has cost %d.\n", Aig_ObjName(pNode), CostCur );
        if ( CostBest > CostCur ||
            (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
    assert( CostBest < 3 );
    if ( Vec_PtrSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
    assert( Aig_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vFront, pFaninBest );
//printf( "Removing fanin %s.\n", Aig_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Aig_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Aig_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( Vec_PtrSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}